

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O0

range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
 __thiscall
tchecker::system::loc_edges_maps_t::edges(loc_edges_maps_t *this,loc_id_t loc,event_id_t event)

{
  size_type sVar1;
  ulong uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar5;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  local_48;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  local_40;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  local_38;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  local_30;
  uint local_28;
  uint local_24;
  event_id_t event_local;
  loc_id_t loc_local;
  loc_edges_maps_t *this_local;
  
  local_28 = event;
  local_24 = loc;
  _event_local = this;
  sVar1 = std::
          vector<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
          ::size(&this->_loc_event_to_edges);
  if (loc < sVar1) {
    uVar2 = (ulong)local_28;
    pvVar3 = std::
             vector<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
             ::operator[](&this->_loc_event_to_edges,(ulong)local_24);
    sVar1 = std::
            vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
            ::size(pvVar3);
    if (uVar2 < sVar1) {
      pvVar3 = std::
               vector<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
               ::operator[](&this->_loc_event_to_edges,(ulong)local_24);
      pvVar4 = std::
               vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
               ::operator[](pvVar3,(ulong)local_28);
      local_40._M_current =
           (shared_ptr<tchecker::system::edge_t> *)
           std::
           vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
           ::begin(pvVar4);
      pvVar3 = std::
               vector<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
               ::operator[](&this->_loc_event_to_edges,(ulong)local_24);
      pvVar4 = std::
               vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
               ::operator[](pvVar3,(ulong)local_28);
      local_48._M_current =
           (shared_ptr<tchecker::system::edge_t> *)
           std::
           vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
           ::end(pvVar4);
      rVar5 = make_range<tchecker::system::edges_collection_const_iterator_t,tchecker::system::edges_collection_const_iterator_t,__gnu_cxx::__normal_iterator<std::shared_ptr<tchecker::system::edge_t>const*,std::vector<std::shared_ptr<tchecker::system::edge_t>,std::allocator<std::shared_ptr<tchecker::system::edge_t>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<tchecker::system::edge_t>const*,std::vector<std::shared_ptr<tchecker::system::edge_t>,std::allocator<std::shared_ptr<tchecker::system::edge_t>>>>>
                        (&local_40,&local_48);
      return rVar5;
    }
  }
  local_30._M_current =
       (shared_ptr<tchecker::system::edge_t> *)
       std::
       vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
       ::begin((vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                *)_empty_edges);
  local_38._M_current =
       (shared_ptr<tchecker::system::edge_t> *)
       std::
       vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
       ::end((vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
              *)_empty_edges);
  rVar5 = make_range<tchecker::system::edges_collection_const_iterator_t,tchecker::system::edges_collection_const_iterator_t,__gnu_cxx::__normal_iterator<std::shared_ptr<tchecker::system::edge_t>const*,std::vector<std::shared_ptr<tchecker::system::edge_t>,std::allocator<std::shared_ptr<tchecker::system::edge_t>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<tchecker::system::edge_t>const*,std::vector<std::shared_ptr<tchecker::system::edge_t>,std::allocator<std::shared_ptr<tchecker::system::edge_t>>>>>
                    (&local_30,&local_38);
  return rVar5;
}

Assistant:

tchecker::range_t<tchecker::system::edges_collection_const_iterator_t> loc_edges_maps_t::edges(tchecker::loc_id_t loc,
                                                                                               tchecker::event_id_t event) const
{
  if (loc >= _loc_event_to_edges.size() || event >= _loc_event_to_edges[loc].size())
    return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_empty_edges.begin(), _empty_edges.end());
  return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_loc_event_to_edges[loc][event].begin(),
                                                                                   _loc_event_to_edges[loc][event].end());
}